

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_parse_frame_header(lws *wsi)

{
  lws_h2_netconn *plVar1;
  int iVar2;
  lws *plVar3;
  lws_h2_protocol_send *pps_00;
  uint32_t uVar4;
  uint32_t uVar5;
  int local_44;
  lws *local_38;
  lws *w;
  int n;
  lws_h2_protocol_send *pps;
  lws_h2_netconn *h2n;
  lws *wsi_local;
  
  plVar1 = (wsi->h2).h2n;
  plVar1->count = 0;
  plVar1->swsi = wsi;
  plVar1->sid = plVar1->sid & 0x7fffffff;
  if ((plVar1->sid != 0) && ((plVar1->sid & 1) == 0)) {
    lws_h2_goaway(wsi,1,"Even Stream ID");
    return 0;
  }
  if (wsi->immortal_substream_count == '\0') {
    if (wsi->vhost->keepalive_timeout == 0) {
      local_44 = 0x1f;
    }
    else {
      local_44 = wsi->vhost->keepalive_timeout;
    }
    lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,local_44);
  }
  if (plVar1->sid != 0) {
    plVar3 = lws_wsi_mux_from_id(wsi,plVar1->sid);
    plVar1->swsi = plVar3;
  }
  uVar4 = plVar1->sid;
  uVar5 = plVar1->length;
  _lws_log(0x10,"%p (%p): fr hdr: typ 0x%x, fla 0x%x, sid 0x%x, len 0x%x\n",wsi,plVar1->swsi,
           (ulong)plVar1->type,(ulong)plVar1->flags,uVar4,uVar5);
  if (((*(ushort *)&plVar1->field_0xa8 >> 5 & 1) != 0) && (plVar1->highest_sid < plVar1->sid)) {
    plVar1->type = '\n';
  }
  if (plVar1->type == '\n') {
    return 0;
  }
  if ((plVar1->our_set).s[5] < plVar1->length) {
    _lws_log(8,"%s: received oversize frame %d\n","lws_h2_parse_frame_header",(ulong)plVar1->length)
    ;
    lws_h2_goaway(wsi,6,"Peer ignored our frame size setting");
    return 1;
  }
  if (plVar1->swsi == (lws *)0x0) {
    if (plVar1->type == '\0') {
      if ((plVar1->highest_sid_opened < plVar1->sid) ||
         ((*(ulong *)&wsi->field_0x2dc >> 0x36 & 1) == 0)) {
        lws_h2_goaway(wsi,5,"Data for nonexistent sid");
        return 0;
      }
      _lws_log(4,"ignoring straggling data fl 0x%x\n",(ulong)plVar1->flags);
      plVar1->type = '\n';
    }
    if (((plVar1->highest_sid_opened < plVar1->sid) && (plVar1->type != '\x01')) &&
       (plVar1->type != '\x02')) {
      _lws_log(8,"%s: wsi %p, No child for sid %d, rxcmd %d\n","lws_h2_parse_frame_header",
               plVar1->swsi,(ulong)plVar1->sid,(ulong)plVar1->type,uVar4,uVar5);
      lws_h2_goaway(wsi,5,"Data for nonexistent sid");
      return 0;
    }
  }
  else {
    _lws_log(8,"%s: wsi %p, State: %s, received cmd %d\n","lws_h2_parse_frame_header",plVar1->swsi,
             h2_state_names[(plVar1->swsi->h2).h2_state],(ulong)plVar1->type,uVar4,uVar5);
  }
  if (((plVar1->swsi != (lws *)0x0) && (plVar1->sid != 0)) &&
     (((uint)http2_rx_validity[(plVar1->swsi->h2).h2_state] & 1 << (plVar1->type & 0x1f)) == 0)) {
    _lws_log(8,"%s: wsi %p, State: %s, ILLEGAL cmdrx %d (OK 0x%x)\n","lws_h2_parse_frame_header",
             plVar1->swsi,h2_state_names[(plVar1->swsi->h2).h2_state],(ulong)plVar1->type,
             (uint)http2_rx_validity[(plVar1->swsi->h2).h2_state],uVar5);
    if (((plVar1->swsi->h2).h2_state == '\x06') || ((plVar1->swsi->h2).h2_state == '\x04')) {
      w._4_4_ = 5;
    }
    else {
      w._4_4_ = 1;
    }
    lws_h2_goaway(wsi,w._4_4_,"invalid rx for state");
    return 0;
  }
  if (((*(ushort *)&plVar1->field_0xa8 >> 3 & 1) != 0) &&
     ((plVar1->cont_exp_sid != plVar1->sid || (plVar1->type != '\t')))) {
    _lws_log(8,"%s: expected cont on sid %u (got %d on sid %u)\n","lws_h2_parse_frame_header",
             (ulong)plVar1->cont_exp_sid,(ulong)plVar1->type,(ulong)plVar1->sid,uVar4,uVar5);
    *(ushort *)&plVar1->field_0xa8 = *(ushort *)&plVar1->field_0xa8 & 0xfff7;
    if ((*(ushort *)&plVar1->field_0xa8 >> 4 & 1) == 0) {
      w._4_4_ = 1;
    }
    else {
      w._4_4_ = 9;
    }
    lws_h2_goaway(wsi,w._4_4_,"Continuation hdrs State");
    return 0;
  }
  switch(plVar1->type) {
  case '\0':
    _lws_log(8,"seen incoming LWS_H2_FRAME_TYPE_DATA start\n");
    if (plVar1->sid == 0) {
      _lws_log(8,"DATA: 0 sid\n");
      lws_h2_goaway(wsi,1,"DATA 0 sid");
    }
    else {
      _lws_log(8,"Frame header DATA: sid %u, flags 0x%x, len %u\n",(ulong)plVar1->sid,
               (ulong)plVar1->flags,(ulong)plVar1->length);
      if (plVar1->swsi == (lws *)0x0) {
        _lws_log(4,"DATA: NULL swsi\n");
      }
      else {
        _lws_log(8,"DATA rx on state %d\n",(ulong)(plVar1->swsi->h2).h2_state);
        if (((plVar1->swsi->h2).h2_state == '\x04') || ((plVar1->swsi->h2).h2_state == '\x06')) {
          lws_h2_goaway(wsi,5,"conn closed");
        }
        else if (plVar1->length == 0) {
          lws_h2_parse_end_of_frame(wsi);
        }
      }
    }
    break;
  case '\x01':
    _lws_log(8,"HEADERS: frame header: sid = %u\n",(ulong)plVar1->sid);
    if (plVar1->sid == 0) {
      lws_h2_goaway(wsi,1,"sid 0");
      return 1;
    }
    if ((((plVar1->swsi != (lws *)0x0) && (((plVar1->swsi->h2).field_0x11 & 1) == 0)) &&
        (((byte)(plVar1->swsi->h2).field_0x11 >> 1 & 1) != 0)) && ((plVar1->flags & 1) == 0)) {
      lws_h2_goaway(wsi,1,"extra HEADERS together");
      return 1;
    }
    if ((*(ulong *)&wsi->field_0x2dc >> 0x36 & 1) == 0) {
      if (plVar1->swsi == (lws *)0x0) {
        if ((((wsi->h2).h2n)->our_set).s[3] < (wsi->mux).child_count + 1) {
          lws_h2_goaway(wsi,1,"Another stream not allowed");
          return 1;
        }
        plVar3 = lws_wsi_server_new(wsi->vhost,wsi,plVar1->sid);
        plVar1->swsi = plVar3;
        if (plVar1->swsi == (lws *)0x0) {
          lws_h2_goaway(wsi,1,"OOM");
          return 1;
        }
        (plVar1->swsi->h2).field_0x11 = (plVar1->swsi->h2).field_0x11 & 0xef | 0x10;
        iVar2 = lws_h2_update_peer_txcredit(plVar1->swsi,(plVar1->swsi->mux).my_sid,0x40000);
        if (iVar2 != 0) {
          return 1;
        }
      }
      if (((plVar1->swsi->http).ah == (allocated_headers *)0x0) &&
         (iVar2 = lws_header_table_attach(plVar1->swsi,0), iVar2 != 0)) {
        _lws_log(1,"%s: Failed to get ah\n","lws_h2_parse_frame_header");
        return 1;
      }
      for (local_38 = (wsi->mux).child_list; local_38 != (lws *)0x0;
          local_38 = (local_38->mux).sibling_list) {
        if (((local_38->mux).my_sid < plVar1->sid) && ((local_38->h2).h2_state == '\0')) {
          lws_close_free_wsi(local_38,LWS_CLOSE_STATUS_NOSTATUS,"h2 sid close");
        }
        if ((local_38->mux).sibling_list == local_38) {
          __assert_fail("w->mux.sibling_list != w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/http2.c"
                        ,0x4e5,"int lws_h2_parse_frame_header(struct lws *)");
        }
      }
      if ((plVar1->swsi->vhost->options & 0x100000000) == 0x100000000) {
        lws_mux_mark_immortal(plVar1->swsi);
        _lws_log(8,"%s: %p: h2 stream entering long poll\n","lws_h2_parse_frame_header",plVar1->swsi
                );
      }
      else {
        (plVar1->swsi->h2).field_0x11 =
             (plVar1->swsi->h2).field_0x11 & 0xfe | (plVar1->flags & 1) != 0;
        _lws_log(0x10,"%s: hdr END_STREAM = %d\n","lws_h2_parse_frame_header",
                 (ulong)((plVar1->swsi->h2).field_0x11 & 1));
      }
      *(ushort *)&plVar1->field_0xa8 =
           *(ushort *)&plVar1->field_0xa8 & 0xfff7 | (ushort)((plVar1->flags & 4) == 0) << 3;
      plVar1->cont_exp_sid = plVar1->sid;
      *(ushort *)&plVar1->field_0xa8 = *(ushort *)&plVar1->field_0xa8 & 0xffef | 0x10;
    }
    else if (plVar1->sid != 0) {
      plVar3 = lws_wsi_mux_from_id(wsi,plVar1->sid);
      plVar1->swsi = plVar3;
      _lws_log(8,"HEADERS: nwsi %p: sid %u mapped to wsi %p\n",wsi,(ulong)plVar1->sid,plVar1->swsi);
      if (plVar1->swsi == (lws *)0x0) break;
    }
    goto LAB_0014951d;
  case '\x02':
    _lws_log(8,"LWS_H2_FRAME_TYPE_PRIORITY complete frame\n");
    if (plVar1->sid == 0) {
      lws_h2_goaway(wsi,1,"Priority has 0 sid");
    }
    else if (plVar1->length != 5) {
      lws_h2_goaway(wsi,6,"Priority has length other than 5");
    }
    break;
  case '\x03':
    if (plVar1->sid == 0) {
      return 1;
    }
    if (plVar1->swsi == (lws *)0x0) {
      if (plVar1->highest_sid_opened < plVar1->sid) {
        lws_h2_goaway(wsi,1,"crazy sid on RST_STREAM");
        return 1;
      }
    }
    else if (plVar1->length == 4) {
      lws_h2_state(plVar1->swsi,LWS_H2_STATE_CLOSED);
    }
    else {
      lws_h2_goaway(wsi,6,"RST_STREAM can only be length 4");
    }
    break;
  case '\x04':
    _lws_log(8,"LWS_H2_FRAME_TYPE_SETTINGS complete frame\n");
    if (plVar1->sid == 0) {
      if ((plVar1->flags & 1) == 0) {
        if ((plVar1->length == 0) || (plVar1->length % 6 != 0)) {
          lws_h2_goaway(wsi,6,"Settings length error");
        }
        else {
          if (plVar1->type == '\n') {
            return 0;
          }
          if (((*(ulong *)&wsi->field_0x2dc >> 2 & 1) != 0) &&
             (((wsi->flags & 0x20U) == 0 || ((*(ulong *)&wsi->field_0x2dc >> 6 & 1) == 0)))) {
            pps_00 = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
            if (pps_00 == (lws_h2_protocol_send *)0x0) {
              return 1;
            }
            lws_pps_schedule(wsi,pps_00);
            *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffffffbf | 0x40;
          }
        }
      }
      else if (plVar1->length != 0) {
        lws_h2_goaway(wsi,6,"Settings with ACK not allowed payload");
      }
    }
    else {
      lws_h2_goaway(wsi,1,"Settings has nonzero sid");
    }
    break;
  case '\x05':
    _lws_log(8,"LWS_H2_FRAME_TYPE_PUSH_PROMISE complete frame\n");
    lws_h2_goaway(wsi,1,"Server only");
    break;
  case '\x06':
    if (plVar1->sid == 0) {
      if (plVar1->length != 8) {
        lws_h2_goaway(wsi,6,"Ping payload can only be 8");
      }
    }
    else {
      lws_h2_goaway(wsi,1,"Ping has nonzero sid");
    }
    break;
  case '\a':
    _lws_log(0x10,"LWS_H2_FRAME_TYPE_GOAWAY received\n");
    break;
  case '\b':
    if (plVar1->length == 4) {
      _lws_log(8,"LWS_H2_FRAME_TYPE_WINDOW_UPDATE\n");
    }
    else {
      lws_h2_goaway(wsi,6,"window update frame not 4");
    }
    break;
  case '\t':
    _lws_log(8,"LWS_H2_FRAME_TYPE_CONTINUATION: sid = %u %d %d\n",(ulong)plVar1->sid,
             (ulong)(*(ushort *)&plVar1->field_0xa8 >> 3 & 1),(ulong)plVar1->cont_exp_sid);
    if (((((*(ushort *)&plVar1->field_0xa8 >> 3 & 1) == 0) || (plVar1->cont_exp_sid != plVar1->sid))
        || (plVar1->sid == 0)) || (plVar1->swsi == (lws *)0x0)) {
      lws_h2_goaway(wsi,1,"unexpected CONTINUATION");
      break;
    }
    if (((byte)(plVar1->swsi->h2).field_0x11 >> 1 & 1) != 0) {
      lws_h2_goaway(wsi,1,"END_HEADERS already seen");
      break;
    }
LAB_0014951d:
    (plVar1->swsi->h2).field_0x11 =
         (plVar1->swsi->h2).field_0x11 & 0xfd | ((plVar1->flags & 4) != 0) << 1;
    _lws_log(8,"%p: END_HEADERS %d\n",plVar1->swsi,
             (ulong)((byte)(plVar1->swsi->h2).field_0x11 >> 1 & 1));
    if (((byte)(plVar1->swsi->h2).field_0x11 >> 1 & 1) != 0) {
      *(ushort *)&plVar1->field_0xa8 = *(ushort *)&plVar1->field_0xa8 & 0xfff7;
    }
    _lws_log(0x10,"END_HEADERS %d\n",(ulong)((byte)(plVar1->swsi->h2).field_0x11 >> 1 & 1));
    break;
  case '\n':
    break;
  default:
    _lws_log(8,"%s: ILLEGAL FRAME TYPE %d\n","lws_h2_parse_frame_header",(ulong)plVar1->type);
    plVar1->type = '\n';
  }
  if (plVar1->length == 0) {
    plVar1->frame_state = '\0';
  }
  return 0;
}

Assistant:

static int
lws_h2_parse_frame_header(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;
	int n;

	/*
	 * We just got the frame header
	 */
	h2n->count = 0;
	h2n->swsi = wsi;
	/* b31 is a reserved bit */
	h2n->sid = h2n->sid & 0x7fffffff;

	if (h2n->sid && !(h2n->sid & 1)) {
		lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR, "Even Stream ID");

		return 0;
	}

	/* let the network wsi live a bit longer if subs are active */

	if (!wsi->immortal_substream_count)
		lws_set_timeout(wsi, PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
				wsi->vhost->keepalive_timeout ?
					wsi->vhost->keepalive_timeout : 31);

	if (h2n->sid)
		h2n->swsi = lws_wsi_mux_from_id(wsi, h2n->sid);

	lwsl_debug("%p (%p): fr hdr: typ 0x%x, fla 0x%x, sid 0x%x, len 0x%x\n",
		  wsi, h2n->swsi, h2n->type, h2n->flags, (unsigned int)h2n->sid,
		  (unsigned int)h2n->length);

	if (h2n->we_told_goaway && h2n->sid > h2n->highest_sid)
		h2n->type = LWS_H2_FRAME_TYPE_COUNT; /* ie, IGNORE */

	if (h2n->type == LWS_H2_FRAME_TYPE_COUNT)
		return 0;

	if (h2n->length > h2n->our_set.s[H2SET_MAX_FRAME_SIZE]) {
		/*
		 * peer sent us something bigger than we told
		 * it we would allow
		 */
		lwsl_info("%s: received oversize frame %d\n", __func__,
			  (unsigned int)h2n->length);
		lws_h2_goaway(wsi, H2_ERR_FRAME_SIZE_ERROR,
			      "Peer ignored our frame size setting");
		return 1;
	}

	if (h2n->swsi)
		lwsl_info("%s: wsi %p, State: %s, received cmd %d\n",
		  __func__, h2n->swsi,
		  h2_state_names[h2n->swsi->h2.h2_state], h2n->type);
	else {
		/* if it's data, either way no swsi means CLOSED state */
		if (h2n->type == LWS_H2_FRAME_TYPE_DATA) {
			if (h2n->sid <= h2n->highest_sid_opened
#if defined(LWS_WITH_CLIENT)
					&& wsi->client_h2_alpn
#endif
			) {
				lwsl_notice("ignoring straggling data fl 0x%x\n",
						h2n->flags);
				/* ie, IGNORE */
				h2n->type = LWS_H2_FRAME_TYPE_COUNT;
			} else {
				lws_h2_goaway(wsi, H2_ERR_STREAM_CLOSED,
				      "Data for nonexistent sid");
				return 0;
			}
		}
		/* if the sid is credible, treat as wsi for it closed */
		if (h2n->sid > h2n->highest_sid_opened &&
		    h2n->type != LWS_H2_FRAME_TYPE_HEADERS &&
		    h2n->type != LWS_H2_FRAME_TYPE_PRIORITY) {
			/* if not credible, reject it */
			lwsl_info("%s: wsi %p, No child for sid %d, rxcmd %d\n",
			  __func__, h2n->swsi, (unsigned int)h2n->sid, h2n->type);
			lws_h2_goaway(wsi, H2_ERR_STREAM_CLOSED,
				     "Data for nonexistent sid");
			return 0;
		}
	}

	if (h2n->swsi && h2n->sid &&
	    !(http2_rx_validity[h2n->swsi->h2.h2_state] & (1 << h2n->type))) {
		lwsl_info("%s: wsi %p, State: %s, ILLEGAL cmdrx %d (OK 0x%x)\n",
			  __func__, h2n->swsi,
			  h2_state_names[h2n->swsi->h2.h2_state], h2n->type,
			  http2_rx_validity[h2n->swsi->h2.h2_state]);

		if (h2n->swsi->h2.h2_state == LWS_H2_STATE_CLOSED ||
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_REMOTE)
			n = H2_ERR_STREAM_CLOSED;
		else
			n = H2_ERR_PROTOCOL_ERROR;
		lws_h2_goaway(wsi, n, "invalid rx for state");

		return 0;
	}

	if (h2n->cont_exp && (h2n->cont_exp_sid != h2n->sid ||
			      h2n->type != LWS_H2_FRAME_TYPE_CONTINUATION)) {
		lwsl_info("%s: expected cont on sid %u (got %d on sid %u)\n",
			  __func__, (unsigned int)h2n->cont_exp_sid, h2n->type,
			  (unsigned int)h2n->sid);
		h2n->cont_exp = 0;
		if (h2n->cont_exp_headers)
			n = H2_ERR_COMPRESSION_ERROR;
		else
			n = H2_ERR_PROTOCOL_ERROR;
		lws_h2_goaway(wsi, n, "Continuation hdrs State");

		return 0;
	}

	switch (h2n->type) {
	case LWS_H2_FRAME_TYPE_DATA:
		lwsl_info("seen incoming LWS_H2_FRAME_TYPE_DATA start\n");
		if (!h2n->sid) {
			lwsl_info("DATA: 0 sid\n");
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR, "DATA 0 sid");
			break;
		}
		lwsl_info("Frame header DATA: sid %u, flags 0x%x, len %u\n",
				(unsigned int)h2n->sid, h2n->flags,
				(unsigned int)h2n->length);

		if (!h2n->swsi) {
			lwsl_notice("DATA: NULL swsi\n");
			break;
		}

		lwsl_info("DATA rx on state %d\n", h2n->swsi->h2.h2_state);

		if (
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_REMOTE ||
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_CLOSED) {
			lws_h2_goaway(wsi, H2_ERR_STREAM_CLOSED, "conn closed");
			break;
		}

		if (h2n->length == 0)
			lws_h2_parse_end_of_frame(wsi);

		break;

	case LWS_H2_FRAME_TYPE_PRIORITY:
		lwsl_info("LWS_H2_FRAME_TYPE_PRIORITY complete frame\n");
		if (!h2n->sid) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Priority has 0 sid");
			break;
		}
		if (h2n->length != 5) {
			lws_h2_goaway(wsi, H2_ERR_FRAME_SIZE_ERROR,
				      "Priority has length other than 5");
			break;
		}
		break;
	case LWS_H2_FRAME_TYPE_PUSH_PROMISE:
		lwsl_info("LWS_H2_FRAME_TYPE_PUSH_PROMISE complete frame\n");
		lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR, "Server only");
		break;

	case LWS_H2_FRAME_TYPE_GOAWAY:
		lwsl_debug("LWS_H2_FRAME_TYPE_GOAWAY received\n");
		break;

	case LWS_H2_FRAME_TYPE_RST_STREAM:
		if (!h2n->sid)
			return 1;
		if (!h2n->swsi) {
			if (h2n->sid <= h2n->highest_sid_opened)
				break;
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "crazy sid on RST_STREAM");
			return 1;
		}
		if (h2n->length != 4) {
			lws_h2_goaway(wsi, H2_ERR_FRAME_SIZE_ERROR,
				      "RST_STREAM can only be length 4");
			break;
		}
		lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);
		break;

	case LWS_H2_FRAME_TYPE_SETTINGS:
		lwsl_info("LWS_H2_FRAME_TYPE_SETTINGS complete frame\n");
		/* nonzero sid on settings is illegal */
		if (h2n->sid) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					 "Settings has nonzero sid");
			break;
		}

		if (!(h2n->flags & LWS_H2_FLAG_SETTINGS_ACK)) {
			if ((!h2n->length) || h2n->length % 6) {
				lws_h2_goaway(wsi, H2_ERR_FRAME_SIZE_ERROR,
						 "Settings length error");
				break;
			}

			if (h2n->type == LWS_H2_FRAME_TYPE_COUNT)
				return 0;

			if (wsi->upgraded_to_http2 &&
#if defined(LWS_WITH_CLIENT)
			    (!(wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) ||
#else
			    (
#endif
					    !wsi->h2_acked_settings)) {

				pps = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
				if (!pps)
					return 1;
				lws_pps_schedule(wsi, pps);
				wsi->h2_acked_settings = 1;
			}
			break;
		}
		/* came to us with ACK set... not allowed to have payload */

		if (h2n->length) {
			lws_h2_goaway(wsi, H2_ERR_FRAME_SIZE_ERROR,
				      "Settings with ACK not allowed payload");
			break;
		}
		break;
	case LWS_H2_FRAME_TYPE_PING:
		if (h2n->sid) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Ping has nonzero sid");
			break;
		}
		if (h2n->length != 8) {
			lws_h2_goaway(wsi, H2_ERR_FRAME_SIZE_ERROR,
				      "Ping payload can only be 8");
			break;
		}
		break;
	case LWS_H2_FRAME_TYPE_CONTINUATION:
		lwsl_info("LWS_H2_FRAME_TYPE_CONTINUATION: sid = %u %d %d\n",
			  (unsigned int)h2n->sid, (int)h2n->cont_exp,
			  (int)h2n->cont_exp_sid);

		if (!h2n->cont_exp ||
		     h2n->cont_exp_sid != h2n->sid ||
		     !h2n->sid ||
		     !h2n->swsi) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "unexpected CONTINUATION");
			break;
		}

		if (h2n->swsi->h2.END_HEADERS) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "END_HEADERS already seen");
			break;
		}
		/* END_STREAM is in HEADERS, skip resetting it */
		goto update_end_headers;

	case LWS_H2_FRAME_TYPE_HEADERS:
		lwsl_info("HEADERS: frame header: sid = %u\n",
				(unsigned int)h2n->sid);
		if (!h2n->sid) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR, "sid 0");
			return 1;
		}

		if (h2n->swsi && !h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->h2.END_HEADERS &&
		    !(h2n->flags & LWS_H2_FLAG_END_STREAM)) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "extra HEADERS together");
			return 1;
		}

#if defined(LWS_WITH_CLIENT)
		if (wsi->client_h2_alpn) {
			if (h2n->sid) {
				h2n->swsi = lws_wsi_mux_from_id(wsi, h2n->sid);
				lwsl_info("HEADERS: nwsi %p: sid %u mapped "
					  "to wsi %p\n", wsi,
					  (unsigned int)h2n->sid, h2n->swsi);
				if (!h2n->swsi)
					break;
			}
			goto update_end_headers;
		}
#endif

		if (!h2n->swsi) {
			/* no more children allowed by parent */
			if (wsi->mux.child_count + 1 >
			    wsi->h2.h2n->our_set.s[H2SET_MAX_CONCURRENT_STREAMS]) {
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				"Another stream not allowed");

				return 1;
			}

			/*
			 * The peer has sent us a HEADERS implying the creation
			 * of a new stream
			 */

			h2n->swsi = lws_wsi_server_new(wsi->vhost, wsi,
						       h2n->sid);
			if (!h2n->swsi) {
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					      "OOM");

				return 1;
			}

			h2n->swsi->h2.initialized = 1;

			if (lws_h2_update_peer_txcredit(h2n->swsi,
					h2n->swsi->mux.my_sid, 4 * 65536))
				goto cleanup_wsi;
		}

		/*
		 * ah needs attaching to child wsi, even though
		 * we only fill it from network wsi
		 */
		if (!h2n->swsi->http.ah)
			if (lws_header_table_attach(h2n->swsi, 0)) {
				lwsl_err("%s: Failed to get ah\n", __func__);
				return 1;
			}

		/*
		 * The first use of a new stream identifier implicitly closes
		 * all streams in the "idle" state that might have been
		 * initiated by that peer with a lower-valued stream identifier.
		 *
		 * For example, if a client sends a HEADERS frame on stream 7
		 * without ever sending a frame on stream 5, then stream 5
		 * transitions to the "closed" state when the first frame for
		 * stream 7 is sent or received.
		 */
		lws_start_foreach_ll(struct lws *, w, wsi->mux.child_list) {
			if (w->mux.my_sid < h2n->sid &&
			    w->h2.h2_state == LWS_H2_STATE_IDLE)
				lws_close_free_wsi(w, 0, "h2 sid close");
			assert(w->mux.sibling_list != w);
		} lws_end_foreach_ll(w, mux.sibling_list);

		if (lws_check_opt(h2n->swsi->vhost->options,
			       LWS_SERVER_OPTION_VH_H2_HALF_CLOSED_LONG_POLL)) {

			/*
			 * We don't directly timeout streams that enter the
			 * half-closed remote state, allowing immortal long
			 * poll
			 */
			lws_mux_mark_immortal(h2n->swsi);
			lwsl_info("%s: %p: h2 stream entering long poll\n",
					__func__, h2n->swsi);

		} else {
			h2n->swsi->h2.END_STREAM =
					!!(h2n->flags & LWS_H2_FLAG_END_STREAM);
			lwsl_debug("%s: hdr END_STREAM = %d\n",__func__,
			  h2n->swsi->h2.END_STREAM);
		}

		h2n->cont_exp = !(h2n->flags & LWS_H2_FLAG_END_HEADERS);
		h2n->cont_exp_sid = h2n->sid;
		h2n->cont_exp_headers = 1;
	//	lws_header_table_reset(h2n->swsi, 0);

update_end_headers:
		/* no END_HEADERS means CONTINUATION must come */
		h2n->swsi->h2.END_HEADERS =
				!!(h2n->flags & LWS_H2_FLAG_END_HEADERS);
		lwsl_info("%p: END_HEADERS %d\n", h2n->swsi,
			  h2n->swsi->h2.END_HEADERS);
		if (h2n->swsi->h2.END_HEADERS)
			h2n->cont_exp = 0;
		lwsl_debug("END_HEADERS %d\n", h2n->swsi->h2.END_HEADERS);
		break;

cleanup_wsi:

		return 1;

	case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
		if (h2n->length != 4) {
			lws_h2_goaway(wsi, H2_ERR_FRAME_SIZE_ERROR,
				      "window update frame not 4");
			break;
		}
		lwsl_info("LWS_H2_FRAME_TYPE_WINDOW_UPDATE\n");
		break;
	case LWS_H2_FRAME_TYPE_COUNT:
		break;
	default:
		lwsl_info("%s: ILLEGAL FRAME TYPE %d\n", __func__, h2n->type);
		h2n->type = LWS_H2_FRAME_TYPE_COUNT; /* ie, IGNORE */
		break;
	}
	if (h2n->length == 0)
		h2n->frame_state = 0;

	return 0;
}